

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

uint __thiscall Assimp::FBX::FBXConverter::ConvertVideo(FBXConverter *this,Video *video)

{
  pointer *pppaVar1;
  iterator __position;
  aiTexel *paVar2;
  size_type sVar3;
  char *__s;
  pointer ppaVar4;
  pointer ppaVar5;
  int iVar6;
  ai_uint32 aVar7;
  aiTexture *paVar8;
  size_t sVar9;
  aiTexture *out_tex;
  string ext;
  aiTexture *local_48;
  string local_40;
  
  paVar8 = (aiTexture *)operator_new(0x428);
  paVar8->mWidth = 0;
  paVar8->mHeight = 0;
  paVar8->pcData = (aiTexel *)0x0;
  (paVar8->mFilename).length = 0;
  (paVar8->mFilename).data[0] = '\0';
  memset((paVar8->mFilename).data + 1,0x1b,0x3ff);
  paVar8->achFormatHint[0] = '\0';
  paVar8->achFormatHint[1] = '\0';
  paVar8->achFormatHint[2] = '\0';
  paVar8->achFormatHint[3] = '\0';
  __position._M_current =
       (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = paVar8;
  if (__position._M_current ==
      (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiTexture*,std::allocator<aiTexture*>>::_M_realloc_insert<aiTexture*const&>
              ((vector<aiTexture*,std::allocator<aiTexture*>> *)&this->textures,__position,&local_48
              );
  }
  else {
    *__position._M_current = paVar8;
    pppaVar1 = &(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  local_48->mWidth = (uint)video->contentLength;
  local_48->mHeight = 0;
  paVar2 = (aiTexel *)video->content;
  video->content = (uint8_t *)0x0;
  local_48->pcData = paVar2;
  sVar3 = (video->relativeFileName)._M_string_length;
  BaseImporter::GetExtension(&local_40,&video->relativeFileName + (sVar3 == 0));
  iVar6 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar6 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)local_40._M_string_length,0x6de6dd);
  }
  if (local_40._M_string_length < (char *)0x4) {
    memcpy(local_48->achFormatHint,local_40._M_dataplus._M_p,local_40._M_string_length);
  }
  __s = (&video->relativeFileName)[sVar3 == 0]._M_dataplus._M_p;
  sVar9 = strlen(__s);
  paVar8 = local_48;
  aVar7 = (ai_uint32)sVar9;
  if ((int)aVar7 < 0x400) {
    (local_48->mFilename).length = aVar7;
    memcpy((local_48->mFilename).data,__s,(long)(int)aVar7);
    (paVar8->mFilename).data[(int)aVar7] = '\0';
  }
  ppaVar4 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppaVar5 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (int)((ulong)((long)ppaVar5 - (long)ppaVar4) >> 3) - 1;
}

Assistant:

unsigned int FBXConverter::ConvertVideo(const Video& video)
        {
            // generate empty output texture
            aiTexture* out_tex = new aiTexture();
            textures.push_back(out_tex);

            // assuming the texture is compressed
            out_tex->mWidth = static_cast<unsigned int>(video.ContentLength()); // total data size
            out_tex->mHeight = 0; // fixed to 0

            // steal the data from the Video to avoid an additional copy
            out_tex->pcData = reinterpret_cast<aiTexel*>(const_cast<Video&>(video).RelinquishContent());

            // try to extract a hint from the file extension
            const std::string& filename = video.RelativeFilename().empty() ? video.FileName() : video.RelativeFilename();
            std::string ext = BaseImporter::GetExtension(filename);

            if (ext == "jpeg") {
                ext = "jpg";
            }

            if (ext.size() <= 3) {
                memcpy(out_tex->achFormatHint, ext.c_str(), ext.size());
            }

            out_tex->mFilename.Set(filename.c_str());

            return static_cast<unsigned int>(textures.size() - 1);
        }